

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::PostResolutionChecks::checkPropertyValue(Expression *value)

{
  int iVar1;
  Type type;
  pool_ptr<soul::AST::Constant> constValue;
  char local_a0 [4];
  uint local_9c;
  Structure *local_90;
  long *local_88;
  CompileMessage local_80;
  CompileMessage local_48;
  
  iVar1 = (*(value->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
  if ((char)iVar1 == '\0') {
    CompileMessageHelpers::createMessage<>
              (&local_48,syntax,error,"Property values must be compile-time constants");
    AST::Context::throwError(&(value->super_Statement).super_ASTObject.context,&local_48,false);
  }
  (*(value->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_88,value);
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x20))(local_a0);
    if (((local_9c & 0xfffffffe) != 2 || local_a0[0] != '\x01') &&
       (local_a0[0] != '\a' && (2 < local_9c - 7 || local_a0[0] != '\x01'))) {
      CompileMessageHelpers::createMessage<>
                (&local_80,syntax,error,"Unsupported property value data type");
      AST::Context::throwError(&(value->super_Statement).super_ASTObject.context,&local_80,false);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_90);
  }
  return;
}

Assistant:

static void checkPropertyValue (AST::Expression& value)
        {
            if (! value.isCompileTimeConstant())
                value.context.throwError (Errors::propertyMustBeConstant());

            if (auto constValue = value.getAsConstant())
            {
                auto type = constValue->getResultType();

                if (! (type.isPrimitiveFloat() || type.isPrimitiveInteger()
                        || type.isPrimitiveBool() || type.isStringLiteral()))
                    value.context.throwError (Errors::illegalPropertyType());
            }
        }